

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O1

void av1_update_state(AV1_COMP *cpi,ThreadData_conflict *td,PICK_MODE_CONTEXT *ctx,int mi_row,
                     int mi_col,BLOCK_SIZE bsize,RUN_TYPE dry_run)

{
  AV1_COMMON *cm;
  uint64_t *puVar1;
  int *piVar2;
  CANDIDATE_MV *pCVar3;
  uint *puVar4;
  uint8_t uVar5;
  BLOCK_SIZE BVar6;
  char cVar7;
  _Bool _Var8;
  int iVar9;
  MB_MODE_INFO *__dest;
  MB_MODE_INFO *pMVar10;
  MB_MODE_INFO *pMVar11;
  FRAME_COUNTS *pFVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  CANDIDATE_MV CVar17;
  CANDIDATE_MV CVar18;
  CANDIDATE_MV CVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  uint uVar23;
  uint uVar24;
  EncSegmentationInfo *pEVar25;
  uint8_t **ppuVar26;
  ushort uVar27;
  undefined4 uVar28;
  MB_MODE_INFO_EXT_FRAME *pMVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  uint8_t *puVar33;
  uint8_t *puVar34;
  byte bVar35;
  int dir;
  uint uVar36;
  int iVar37;
  ulong uVar38;
  int iVar39;
  char cVar40;
  byte bVar41;
  int iVar42;
  int iVar43;
  uint uVar44;
  uint uVar45;
  long lVar46;
  uint uVar47;
  uint uVar48;
  undefined7 in_register_00000089;
  long lVar49;
  int iVar50;
  ulong uVar51;
  int iVar52;
  bool bVar53;
  short sVar54;
  short sVar58;
  short sVar59;
  short sVar60;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar61 [16];
  int bw;
  int bh;
  
  uVar5 = ((cpi->common).seq_params)->monochrome;
  __dest = *(td->mb).e_mbd.mi;
  BVar6 = (ctx->mic).bsize;
  uVar30 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar6]
  ;
  uVar45 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar6]
  ;
  iVar37 = (cpi->common).mi_params.mi_stride;
  uVar51 = CONCAT71(in_register_00000089,bsize) & 0xffffffff;
  uVar24 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [uVar51];
  uVar48 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [uVar51];
  memcpy(__dest,ctx,0xb0);
  pMVar29 = &ctx->mbmi_ext_best;
  bVar41 = (ctx->mic).ref_frame[0];
  cVar7 = (ctx->mic).ref_frame[1];
  if ('\0' < cVar7) {
    cVar40 = -1;
    if (cVar7 < '\x05' || '\x04' < (char)bVar41) {
      lVar46 = 0;
      do {
        if ((bVar41 == (&comp_ref0_lut)[lVar46]) && (cVar7 == (&comp_ref1_lut)[lVar46])) {
          cVar40 = (char)lVar46;
          break;
        }
        lVar46 = lVar46 + 1;
      } while (lVar46 != 9);
    }
    if (cVar40 < '\0') {
      bVar41 = (cVar7 * '\x04' + bVar41) - 0xd;
    }
    else {
      bVar41 = cVar40 + 0x14;
    }
  }
  CVar17 = pMVar29->ref_mv_stack[0];
  CVar18 = (ctx->mbmi_ext_best).ref_mv_stack[1];
  CVar19 = (ctx->mbmi_ext_best).ref_mv_stack[3];
  pCVar3 = (td->mb).mbmi_ext.ref_mv_stack[bVar41] + 2;
  *pCVar3 = (ctx->mbmi_ext_best).ref_mv_stack[2];
  pCVar3[1] = CVar19;
  pCVar3 = (td->mb).mbmi_ext.ref_mv_stack[bVar41];
  *pCVar3 = CVar17;
  pCVar3[1] = CVar18;
  (td->mb).mbmi_ext.weight[bVar41] = *&(ctx->mbmi_ext_best).weight;
  (td->mb).mbmi_ext.mode_context[bVar41] = (ctx->mbmi_ext_best).mode_context;
  (td->mb).mbmi_ext.ref_mv_count[bVar41] = (ctx->mbmi_ext_best).ref_mv_count;
  uVar20 = *(undefined8 *)(ctx->mbmi_ext_best).global_mvs;
  uVar21 = *(undefined8 *)((ctx->mbmi_ext_best).global_mvs + 2);
  uVar22 = *(undefined8 *)((ctx->mbmi_ext_best).global_mvs + 6);
  *(undefined8 *)((td->mb).mbmi_ext.global_mvs + 4) =
       *(undefined8 *)((ctx->mbmi_ext_best).global_mvs + 4);
  *(undefined8 *)((td->mb).mbmi_ext.global_mvs + 6) = uVar22;
  *(undefined8 *)(td->mb).mbmi_ext.global_mvs = uVar20;
  *(undefined8 *)((td->mb).mbmi_ext.global_mvs + 2) = uVar21;
  memcpy((td->mb).txfm_search_info.blk_skip,ctx->blk_skip,(long)ctx->num_4x4_blk);
  uVar31 = (uint)pMVar29;
  (td->mb).txfm_search_info.skip_txfm = (ctx->rd_stats).skip_txfm;
  (td->mb).e_mbd.tx_type_map = ctx->tx_type_map;
  (td->mb).e_mbd.tx_type_map_stride = uVar24;
  if (dry_run == '\0') {
    uVar23 = (cpi->common).mi_params.mi_stride;
    uVar51 = (ulong)uVar23;
    puVar33 = (cpi->common).mi_params.tx_type_map + (int)(uVar23 * mi_row + mi_col);
    uVar38 = 0;
    puVar34 = puVar33;
    do {
      memcpy(puVar34,(td->mb).e_mbd.tx_type_map + (long)(td->mb).e_mbd.tx_type_map_stride * uVar38,
             (ulong)uVar30);
      uVar31 = (uint)uVar51;
      uVar38 = uVar38 + 1;
      puVar34 = puVar34 + (int)uVar23;
    } while (uVar45 + (uVar45 == 0) != uVar38);
    (td->mb).e_mbd.tx_type_map = puVar33;
    (td->mb).e_mbd.tx_type_map_stride = uVar23;
  }
  cm = &cpi->common;
  if ((cpi->common).seg.enabled != '\0') {
    if ((cpi->oxcf).q_cfg.aq_mode == '\x02') {
      pEVar25 = &cpi->enc_seg;
      if ((cpi->common).seg.update_map == '\0') {
        pEVar25 = (EncSegmentationInfo *)&(cpi->common).last_frame_seg_map;
      }
      if (pEVar25->map == (uint8_t *)0x0) {
        uVar23 = 0;
      }
      else {
        uVar31 = (cpi->common).mi_params.mi_rows - mi_row;
        if ((int)uVar48 <= (int)uVar31) {
          uVar31 = uVar48;
        }
        uVar23 = 0;
        if (0 < (int)uVar31) {
          iVar39 = (cpi->common).mi_params.mi_cols;
          uVar47 = iVar39 - mi_col;
          if ((int)uVar24 <= iVar39 - mi_col) {
            uVar47 = uVar24;
          }
          iVar43 = iVar39 * mi_row + mi_col;
          bVar41 = 8;
          do {
            uVar51 = (ulong)uVar47;
            iVar50 = iVar43;
            bVar35 = bVar41;
            if (0 < (int)uVar47) {
              do {
                bVar41 = pEVar25->map[iVar50];
                if (bVar35 < bVar41) {
                  bVar41 = bVar35;
                }
                iVar50 = iVar50 + 1;
                uVar51 = uVar51 - 1;
                bVar35 = bVar41;
              } while (uVar51 != 0);
            }
            uVar23 = uVar23 + 1;
            iVar43 = iVar43 + iVar39;
          } while (uVar23 != uVar31);
          uVar23 = (uint)(bVar41 & 7);
        }
      }
      uVar31 = *(ushort *)&__dest->field_0xa7 & 0xfffffff8;
      *(ushort *)&__dest->field_0xa7 = (ushort)uVar23 | (ushort)uVar31;
    }
    if ((((cpi->oxcf).q_cfg.aq_mode == '\x03') && ((~*(ushort *)&__dest->field_0xa7 & 7) != 0)) &&
       ((cpi->rc).rtc_external_ratectrl == 0)) {
      uVar31 = mi_col;
      av1_cyclic_refresh_update_segment
                (cpi,&td->mb,mi_row,mi_col,bsize,(long)(ctx->rd_stats).rate,(ctx->rd_stats).dist,
                 (uint)(td->mb).txfm_search_info.skip_txfm,dry_run);
    }
    if (__dest->uv_mode == '\r') {
      pMVar10 = *(td->mb).e_mbd.mi;
      uVar51 = (ulong)pMVar10->bsize;
      if ((td->mb).e_mbd.lossless[*(ushort *)&pMVar10->field_0xa7 & 7] == 0) {
        uVar31 = (uint)((0x2f0bffUL >> (uVar51 & 0x3f) & 1) != 0);
        if ((0x1f07ffUL >> (uVar51 & 0x3f) & 1) == 0) {
          uVar31 = 0;
        }
      }
      else {
        iVar39 = (td->mb).e_mbd.plane[1].subsampling_x;
        uVar31 = (uint)CONCAT71((int7)(int3)((uint)iVar39 >> 8),
                                av1_ss_size_lookup[uVar51][iVar39]
                                [(td->mb).e_mbd.plane[1].subsampling_y] == BLOCK_4X4);
      }
      if ((char)uVar31 == '\0') {
        __dest->uv_mode = '\0';
      }
    }
    if (dry_run != '\0') goto LAB_001a0bb6;
    if (__dest->skip_txfm == '\0') {
      iVar50 = 2 - (uint)(cpi->cyclic_refresh->skip_over4x4 == 0);
      iVar39 = (td->mb).e_mbd.mi_row;
      iVar43 = (td->mb).e_mbd.mi_col;
      puVar34 = ((cpi->common).cur_frame)->seg_map;
      _Var8 = (td->mb).e_mbd.up_available;
      uVar31 = 0xff;
      if ((_Var8 == true) && ((td->mb).e_mbd.left_available == true)) {
        if ((cpi->common).mi_params.mi_rows - (iVar39 - iVar50) < 1) {
          uVar31 = 8;
        }
        else {
          iVar9 = (cpi->common).mi_params.mi_cols;
          uVar23 = iVar9 - (iVar43 - iVar50);
          uVar31 = 1;
          if ((int)uVar23 < 1) {
            uVar31 = uVar23;
          }
          iVar32 = ((iVar39 - iVar50) * iVar9 + iVar43) - iVar50;
          bVar41 = 8;
          bVar35 = 8;
          iVar42 = 0;
          do {
            uVar51 = (ulong)uVar31;
            iVar52 = iVar32;
            if (0 < (int)uVar23) {
              do {
                bVar35 = puVar34[iVar52];
                if (bVar41 < puVar34[iVar52]) {
                  bVar35 = bVar41;
                }
                iVar52 = iVar52 + 1;
                uVar51 = uVar51 - 1;
                bVar41 = bVar35;
              } while (uVar51 != 0);
            }
            iVar42 = iVar42 + 1;
            iVar32 = iVar32 + iVar9;
          } while (iVar42 != 1);
          uVar31 = (uint)bVar35;
        }
      }
      uVar23 = 0xff;
      if (_Var8 != false) {
        if ((cpi->common).mi_params.mi_rows - (iVar39 - iVar50) < 1) {
          uVar23 = 8;
        }
        else {
          iVar9 = (cpi->common).mi_params.mi_cols;
          uVar36 = iVar9 - iVar43;
          uVar47 = 1;
          if ((int)uVar36 < 1) {
            uVar47 = uVar36;
          }
          iVar42 = (iVar39 - iVar50) * iVar9 + iVar43;
          uVar23 = 8;
          iVar32 = 0;
          do {
            uVar51 = (ulong)uVar47;
            iVar52 = iVar42;
            uVar44 = uVar23;
            if (0 < (int)uVar36) {
              do {
                uVar23 = (uint)puVar34[iVar52];
                if ((byte)uVar44 < puVar34[iVar52]) {
                  uVar23 = uVar44;
                }
                iVar52 = iVar52 + 1;
                uVar51 = uVar51 - 1;
                uVar44 = uVar23;
              } while (uVar51 != 0);
            }
            iVar32 = iVar32 + 1;
            iVar42 = iVar42 + iVar9;
          } while (iVar32 != 1);
        }
      }
      uVar47 = 0xff;
      if ((td->mb).e_mbd.left_available == true) {
        if ((cpi->common).mi_params.mi_rows - iVar39 < 1) {
          uVar47 = 8;
        }
        else {
          iVar9 = (cpi->common).mi_params.mi_cols;
          uVar36 = iVar9 - (iVar43 - iVar50);
          uVar47 = 1;
          if ((int)uVar36 < 1) {
            uVar47 = uVar36;
          }
          iVar50 = (iVar39 * iVar9 + iVar43) - iVar50;
          bVar41 = 8;
          bVar35 = 8;
          iVar39 = 0;
          do {
            uVar51 = (ulong)uVar47;
            iVar43 = iVar50;
            if (0 < (int)uVar36) {
              do {
                bVar35 = puVar34[iVar43];
                if (bVar41 < puVar34[iVar43]) {
                  bVar35 = bVar41;
                }
                iVar43 = iVar43 + 1;
                uVar51 = uVar51 - 1;
                bVar41 = bVar35;
              } while (uVar51 != 0);
            }
            iVar39 = iVar39 + 1;
            iVar50 = iVar50 + iVar9;
          } while (iVar39 != 1);
          uVar47 = (uint)bVar35;
        }
      }
      if (uVar31 == 0xff) {
        uVar36 = 0;
      }
      else if ((uVar31 != uVar23) || (uVar36 = 2, uVar31 != uVar47)) {
        uVar36 = (uint)((uVar47 == uVar23 || uVar31 == uVar47) || uVar31 == uVar23);
      }
      if ((char)uVar23 == -1) {
        uVar44 = 0;
        if (uVar47 != 0xff) {
          uVar44 = uVar47;
        }
      }
      else {
        uVar44 = uVar23;
        if ((uVar47 != 0xff) && (uVar44 = uVar47, uVar31 == uVar23)) {
          uVar44 = uVar23;
        }
      }
      uVar31 = av1_neg_interleave(*(ushort *)&__dest->field_0xa7 & 7,uVar44,
                                  (cpi->common).seg.last_active_segid + 1);
      lVar46 = (long)*(int *)((long)(td->mb).mode_costs.spatial_pred_cost[0] +
                             (ulong)(uVar31 & 0xff) * 4 + (ulong)(uVar36 << 5));
      puVar1 = (td->rd_counts).seg_tmp_pred_cost;
      *puVar1 = *puVar1 + lVar46;
      puVar34 = (cpi->common).last_frame_seg_map;
      if (puVar34 == (uint8_t *)0x0) {
        uVar27 = 0;
      }
      else {
        uVar31 = (cpi->common).mi_params.mi_rows - mi_row;
        if ((int)uVar48 <= (int)uVar31) {
          uVar31 = uVar48;
        }
        if ((int)uVar31 < 1) {
          uVar27 = 8;
        }
        else {
          iVar39 = (cpi->common).mi_params.mi_cols;
          uVar23 = iVar39 - mi_col;
          if ((int)uVar24 <= iVar39 - mi_col) {
            uVar23 = uVar24;
          }
          iVar43 = iVar39 * mi_row + mi_col;
          bVar35 = 8;
          bVar41 = 8;
          uVar47 = 0;
          do {
            uVar51 = (ulong)uVar23;
            iVar50 = iVar43;
            if (0 < (int)uVar23) {
              do {
                bVar41 = puVar34[iVar50];
                if (bVar35 < bVar41) {
                  bVar41 = bVar35;
                }
                iVar50 = iVar50 + 1;
                uVar51 = uVar51 - 1;
                bVar35 = bVar41;
              } while (uVar51 != 0);
            }
            uVar47 = uVar47 + 1;
            iVar43 = iVar43 + iVar39;
          } while (uVar47 != uVar31);
          uVar27 = (ushort)bVar41;
        }
      }
      pMVar10 = (td->mb).e_mbd.left_mbmi;
      pMVar11 = (td->mb).e_mbd.above_mbmi;
      if (pMVar11 == (MB_MODE_INFO *)0x0) {
        uVar31 = 0;
      }
      else {
        uVar31 = *(ushort *)&pMVar11->field_0xa7 >> 3 & 1;
      }
      if (pMVar10 == (MB_MODE_INFO *)0x0) {
        uVar23 = 0;
      }
      else {
        uVar23 = *(ushort *)&pMVar10->field_0xa7 >> 3 & 1;
      }
      bVar53 = uVar27 == (*(ushort *)&__dest->field_0xa7 & 7);
      uVar31 = (td->mb).mode_costs.tmp_pred_cost[uVar23 + uVar31][bVar53];
      if (bVar53) {
        lVar46 = 0;
      }
      puVar1 = (td->rd_counts).seg_tmp_pred_cost + 1;
      *puVar1 = *puVar1 + lVar46 + (int)uVar31;
    }
  }
  if ((dry_run == '\0') && (((cm->current_frame).frame_type & 0xfd) != 0)) {
    uVar51 = *(ulong *)(ctx->mic).mv;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = uVar51;
    if ((((ctx->mic).field_0xa7 & 0x80) != 0) || ('\0' < (ctx->mic).ref_frame[0])) {
      sVar54 = (short)uVar51;
      sVar13 = -sVar54;
      sVar58 = (short)(uVar51 >> 0x10);
      sVar14 = -sVar58;
      sVar59 = (short)(uVar51 >> 0x20);
      sVar15 = -sVar59;
      sVar60 = (short)(uVar51 >> 0x30);
      sVar16 = -sVar60;
      auVar61._0_2_ = (ushort)(sVar13 < sVar54) * sVar54 | (ushort)(sVar13 >= sVar54) * sVar13;
      auVar61._2_2_ = (ushort)(sVar14 < sVar58) * sVar58 | (ushort)(sVar14 >= sVar58) * sVar14;
      auVar61._4_2_ = (ushort)(sVar15 < sVar59) * sVar59 | (ushort)(sVar15 >= sVar59) * sVar15;
      auVar61._6_2_ = (ushort)(sVar16 < sVar60) * sVar60 | (ushort)(sVar16 >= sVar60) * sVar16;
      auVar61._8_8_ = 0;
      auVar55 = pshuflw(auVar55,auVar61,0x50);
      auVar56._0_4_ = auVar55._0_4_;
      auVar56._4_4_ = auVar56._0_4_;
      auVar56._8_4_ = auVar55._4_4_;
      auVar56._12_4_ = auVar55._4_4_;
      auVar56 = auVar56 ^ _DAT_004d48a0;
      auVar57._0_2_ = -(ushort)(-0x7ff9 < auVar56._0_2_);
      auVar57._2_2_ = -(ushort)(-0x7ff9 < auVar56._2_2_);
      auVar57._4_2_ = -(ushort)(-0x7ff9 < auVar56._4_2_);
      auVar57._6_2_ = -(ushort)(-0x7ff9 < auVar56._6_2_);
      auVar57._8_2_ = -(ushort)(-0x7ff9 < auVar56._8_2_);
      auVar57._10_2_ = -(ushort)(-0x7ff9 < auVar56._10_2_);
      auVar57._12_2_ = -(ushort)(-0x7ff9 < auVar56._12_2_);
      auVar57._14_2_ = -(ushort)(-0x7ff9 < auVar56._14_2_);
      uVar28 = movmskpd(uVar31,auVar57);
      if ((byte)((((byte)uVar28 ^ 3) & 2) >> 1 &
                (ctx->mic).ref_frame[0] == '\x01' & ((byte)uVar28 ^ 3)) == 1) {
        uVar31 = (cpi->common).mi_params.mi_rows - mi_row;
        if ((int)uVar45 <= (int)uVar31) {
          uVar31 = uVar45;
        }
        if (0 < (int)uVar31) {
          piVar2 = &(td->mb).cnt_zeromv;
          *piVar2 = *piVar2 + ((uVar31 - 1 & 0xfffffffe) + 2) * uVar30;
        }
      }
    }
  }
LAB_001a0bb6:
  ppuVar26 = &(td->mb).plane[0].txb_entropy_ctx;
  uVar51 = 0;
  do {
    ppuVar26[-2] = (uint8_t *)ctx->coeff[uVar51];
    ppuVar26[-3] = (uint8_t *)ctx->qcoeff[uVar51];
    ppuVar26[-4] = (uint8_t *)ctx->dqcoeff[uVar51];
    ppuVar26[-1] = (uint8_t *)ctx->eobs[uVar51];
    *ppuVar26 = ctx->txb_entropy_ctx[uVar51];
    if (uVar5 != '\0') break;
    ppuVar26 = ppuVar26 + 0x11;
    bVar53 = uVar51 < 2;
    uVar51 = uVar51 + 1;
  } while (bVar53);
  ppuVar26 = &(td->mb).e_mbd.plane[0].color_index_map;
  lVar46 = 0x21;
  do {
    *ppuVar26 = *(uint8_t **)((ctx->mic).mv + lVar46 * 2 + -2);
    lVar46 = lVar46 + 1;
    ppuVar26 = ppuVar26 + 0x146;
  } while (lVar46 == 0x22);
  iVar39 = (td->mb).e_mbd.mb_to_bottom_edge;
  uVar31 = iVar39 >> 0x1f & iVar39 >> 5;
  uVar23 = uVar31 + uVar48;
  if (uVar23 != 0 && SCARRY4(uVar31,uVar48) == (int)uVar23 < 0) {
    iVar39 = (td->mb).e_mbd.mb_to_right_edge;
    uVar24 = (iVar39 >> 0x1f & iVar39 >> 5) + uVar24;
    lVar46 = 0;
    uVar51 = 0;
    do {
      uVar38 = (ulong)uVar24;
      lVar49 = lVar46;
      if (0 < (int)uVar24) {
        do {
          *(MB_MODE_INFO **)((long)(td->mb).e_mbd.mi + lVar49) = __dest;
          uVar38 = uVar38 - 1;
          lVar49 = lVar49 + 8;
        } while (uVar38 != 0);
      }
      uVar51 = uVar51 + 1;
      lVar46 = lVar46 + (long)iVar37 * 8;
    } while (uVar51 != uVar23);
  }
  if ((cpi->oxcf).q_cfg.aq_mode != '\0') {
    av1_init_plane_quantizers(cpi,&td->mb,*(ushort *)&__dest->field_0xa7 & 7,0);
  }
  if (dry_run == '\0') {
    if ((((cm->current_frame).frame_type & 0xfd) != 0) &&
       (((((ctx->mic).field_0xa7 & 0x80) != 0 || ('\0' < (ctx->mic).ref_frame[0])) &&
        ((cpi->common).features.interp_filter == MULTITAP_SHARP2)))) {
      pFVar12 = td->counts;
      iVar37 = 0;
      do {
        iVar39 = av1_get_pred_context_switchable_interp(&(td->mb).e_mbd,iVar37);
        uVar48 = (__dest->interp_filters).as_int >> 0x10;
        if (iVar37 == 0) {
          uVar48 = (__dest->interp_filters).as_int;
        }
        puVar4 = pFVar12->switchable_interp[iVar39] + ((ulong)uVar48 & 0xff);
        *puVar4 = *puVar4 + 1;
        iVar37 = iVar37 + 1;
      } while (iVar37 == 1);
    }
    if ((((cpi->common).seq_params)->order_hint_info).enable_ref_frame_mvs != 0) {
      uVar48 = (cpi->common).mi_params.mi_rows - mi_row;
      if ((int)uVar45 <= (int)uVar48) {
        uVar48 = uVar45;
      }
      uVar45 = (cpi->common).mi_params.mi_cols - mi_col;
      if ((int)uVar30 <= (int)uVar45) {
        uVar45 = uVar30;
      }
      av1_copy_frame_mvs(cm,&ctx->mic,mi_row,mi_col,uVar45,uVar48);
      return;
    }
  }
  return;
}

Assistant:

void av1_update_state(const AV1_COMP *const cpi, ThreadData *td,
                      const PICK_MODE_CONTEXT *const ctx, int mi_row,
                      int mi_col, BLOCK_SIZE bsize, RUN_TYPE dry_run) {
  int i, x_idx, y;
  const AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  struct macroblock_plane *const p = x->plane;
  struct macroblockd_plane *const pd = xd->plane;
  const MB_MODE_INFO *const mi = &ctx->mic;
  MB_MODE_INFO *const mi_addr = xd->mi[0];
  const struct segmentation *const seg = &cm->seg;
  assert(bsize < BLOCK_SIZES_ALL);
  const int bw = mi_size_wide[mi->bsize];
  const int bh = mi_size_high[mi->bsize];
  const int mis = mi_params->mi_stride;
  const int mi_width = mi_size_wide[bsize];
  const int mi_height = mi_size_high[bsize];
  TxfmSearchInfo *txfm_info = &x->txfm_search_info;

  assert(mi->bsize == bsize);

  *mi_addr = *mi;
  copy_mbmi_ext_frame_to_mbmi_ext(&x->mbmi_ext, &ctx->mbmi_ext_best,
                                  av1_ref_frame_type(ctx->mic.ref_frame));

  memcpy(txfm_info->blk_skip, ctx->blk_skip,
         sizeof(txfm_info->blk_skip[0]) * ctx->num_4x4_blk);

  txfm_info->skip_txfm = ctx->rd_stats.skip_txfm;

  xd->tx_type_map = ctx->tx_type_map;
  xd->tx_type_map_stride = mi_size_wide[bsize];
  // If not dry_run, copy the transform type data into the frame level buffer.
  // Encoder will fetch tx types when writing bitstream.
  if (!dry_run) {
    const int grid_idx = get_mi_grid_idx(mi_params, mi_row, mi_col);
    uint8_t *const tx_type_map = mi_params->tx_type_map + grid_idx;
    const int mi_stride = mi_params->mi_stride;
    for (int blk_row = 0; blk_row < bh; ++blk_row) {
      av1_copy_array(tx_type_map + blk_row * mi_stride,
                     xd->tx_type_map + blk_row * xd->tx_type_map_stride, bw);
    }
    xd->tx_type_map = tx_type_map;
    xd->tx_type_map_stride = mi_stride;
  }

  // If segmentation in use
  if (seg->enabled) {
    // For in frame complexity AQ copy the segment id from the segment map.
    if (cpi->oxcf.q_cfg.aq_mode == COMPLEXITY_AQ) {
      const uint8_t *const map =
          seg->update_map ? cpi->enc_seg.map : cm->last_frame_seg_map;
      mi_addr->segment_id =
          map ? get_segment_id(mi_params, map, bsize, mi_row, mi_col) : 0;
    }
    // Else for cyclic refresh mode update the segment map, set the segment id
    // and then update the quantizer.
    if (cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ &&
        mi_addr->segment_id != AM_SEGMENT_ID_INACTIVE &&
        !cpi->rc.rtc_external_ratectrl) {
      av1_cyclic_refresh_update_segment(cpi, x, mi_row, mi_col, bsize,
                                        ctx->rd_stats.rate, ctx->rd_stats.dist,
                                        txfm_info->skip_txfm, dry_run);
    }
    if (mi_addr->uv_mode == UV_CFL_PRED && !is_cfl_allowed(xd))
      mi_addr->uv_mode = UV_DC_PRED;

    if (!dry_run && !mi_addr->skip_txfm) {
      int cdf_num;
      const uint8_t spatial_pred = av1_get_spatial_seg_pred(
          cm, xd, &cdf_num, cpi->cyclic_refresh->skip_over4x4);
      const uint8_t coded_id = av1_neg_interleave(
          mi_addr->segment_id, spatial_pred, seg->last_active_segid + 1);
      int64_t spatial_cost = x->mode_costs.spatial_pred_cost[cdf_num][coded_id];
      td->rd_counts.seg_tmp_pred_cost[0] += spatial_cost;

      const int pred_segment_id =
          cm->last_frame_seg_map
              ? get_segment_id(mi_params, cm->last_frame_seg_map, bsize, mi_row,
                               mi_col)
              : 0;
      const int use_tmp_pred = pred_segment_id == mi_addr->segment_id;
      const uint8_t tmp_pred_ctx = av1_get_pred_context_seg_id(xd);
      td->rd_counts.seg_tmp_pred_cost[1] +=
          x->mode_costs.tmp_pred_cost[tmp_pred_ctx][use_tmp_pred];
      if (!use_tmp_pred) {
        td->rd_counts.seg_tmp_pred_cost[1] += spatial_cost;
      }
    }
  }

  // Count zero motion vector.
  if (!dry_run && !frame_is_intra_only(cm)) {
    const MV mv = mi->mv[0].as_mv;
    if (is_inter_block(mi) && mi->ref_frame[0] == LAST_FRAME &&
        abs(mv.row) < 8 && abs(mv.col) < 8) {
      const int ymis = AOMMIN(cm->mi_params.mi_rows - mi_row, bh);
      // Accumulate low_content_frame.
      for (int mi_y = 0; mi_y < ymis; mi_y += 2) x->cnt_zeromv += bw << 1;
    }
  }

  for (i = 0; i < num_planes; ++i) {
    p[i].coeff = ctx->coeff[i];
    p[i].qcoeff = ctx->qcoeff[i];
    p[i].dqcoeff = ctx->dqcoeff[i];
    p[i].eobs = ctx->eobs[i];
    p[i].txb_entropy_ctx = ctx->txb_entropy_ctx[i];
  }
  for (i = 0; i < 2; ++i) pd[i].color_index_map = ctx->color_index_map[i];
  // Restore the coding context of the MB to that that was in place
  // when the mode was picked for it

  const int cols =
      AOMMIN((xd->mb_to_right_edge >> (3 + MI_SIZE_LOG2)) + mi_width, mi_width);
  const int rows = AOMMIN(
      (xd->mb_to_bottom_edge >> (3 + MI_SIZE_LOG2)) + mi_height, mi_height);
  for (y = 0; y < rows; y++) {
    for (x_idx = 0; x_idx < cols; x_idx++) xd->mi[x_idx + y * mis] = mi_addr;
  }

  if (cpi->oxcf.q_cfg.aq_mode)
    av1_init_plane_quantizers(cpi, x, mi_addr->segment_id, 0);

  if (dry_run) return;

#if CONFIG_INTERNAL_STATS
  {
    unsigned int *const mode_chosen_counts =
        (unsigned int *)cpi->mode_chosen_counts;  // Cast const away.
    if (frame_is_intra_only(cm)) {
      static const int kf_mode_index[] = {
        THR_DC /*DC_PRED*/,
        THR_V_PRED /*V_PRED*/,
        THR_H_PRED /*H_PRED*/,
        THR_D45_PRED /*D45_PRED*/,
        THR_D135_PRED /*D135_PRED*/,
        THR_D113_PRED /*D113_PRED*/,
        THR_D157_PRED /*D157_PRED*/,
        THR_D203_PRED /*D203_PRED*/,
        THR_D67_PRED /*D67_PRED*/,
        THR_SMOOTH,   /*SMOOTH_PRED*/
        THR_SMOOTH_V, /*SMOOTH_V_PRED*/
        THR_SMOOTH_H, /*SMOOTH_H_PRED*/
        THR_PAETH /*PAETH_PRED*/,
      };
      ++mode_chosen_counts[kf_mode_index[mi_addr->mode]];
    } else {
      // Note how often each mode chosen as best
      ++mode_chosen_counts[ctx->best_mode_index];
    }
  }
#endif
  if (!frame_is_intra_only(cm)) {
    if (is_inter_block(mi) && cm->features.interp_filter == SWITCHABLE) {
      // When the frame interp filter is SWITCHABLE, several cases that always
      // use the default type (EIGHTTAP_REGULAR) are described in
      // av1_is_interp_needed(). Here, we should keep the counts for all
      // applicable blocks, so the frame filter resetting decision in
      // fix_interp_filter() is made correctly.
      update_filter_type_count(td->counts, xd, mi_addr);
    }
  }

  const int x_mis = AOMMIN(bw, mi_params->mi_cols - mi_col);
  const int y_mis = AOMMIN(bh, mi_params->mi_rows - mi_row);
  if (cm->seq_params->order_hint_info.enable_ref_frame_mvs)
    av1_copy_frame_mvs(cm, mi, mi_row, mi_col, x_mis, y_mis);
}